

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(std::function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>),std::function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          function<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&)>
          *a)

{
  bool bVar1;
  element_type *this_00;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  undefined1 local_a0 [32];
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&)>
  local_80;
  error_code_enum local_4c;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&)>
  *a_local;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RCX;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_48);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (!bVar1) {
    local_4c = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_4c);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
  ctx = libtorrent::aux::session_impl::get_context(this_00);
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_a0,
             (shared_ptr<libtorrent::aux::session_impl> *)local_48);
  local_a0._16_8_ = f;
  local_a0._24_8_ = a;
  ::std::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&)>
  ::function(&local_80,
             (function<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&)>
              *)s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi);
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(std::function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>),std::function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>&>(void(libtorrent::aux::session_impl::*)(std::function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>),std::function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>&)const::_lambda()_1_>
            (ctx,(type_conflict4 *)local_a0,(type *)0x0);
  const::{lambda()#1}::~async_call((_lambda___1_ *)local_a0);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_48);
  return;
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}